

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O1

void __thiscall
portability_path_test_portability_path_test_join_both_empty_Test::TestBody
          (portability_path_test_portability_path_test_join_both_empty_Test *this)

{
  undefined8 *puVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar;
  string_path join;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1038;
  AssertHelper local_1030;
  internal local_1028 [8];
  undefined8 *local_1020;
  byte local_1018 [4096];
  
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           portability_path_join("",1,"",1,local_1018,0x1000);
  local_1038._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_1038._M_head_impl._4_4_ << 0x20);
  local_1030.data_._0_4_ = (uint)local_1018[0];
  testing::internal::CmpHelperEQ<int,int>
            (local_1028,"(int)0","(int)strcmp(join, result)",(int *)&local_1038,(int *)&local_1030);
  if (local_1028[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1038);
    if (local_1020 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_1020;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x172,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1030,(Message *)&local_1038);
    testing::internal::AssertHelper::~AssertHelper(&local_1030);
    if (local_1038._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1038._M_head_impl + 8))();
    }
  }
  puVar1 = local_1020;
  if (local_1020 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1020 != local_1020 + 2) {
      operator_delete((undefined8 *)*local_1020);
    }
    operator_delete(puVar1);
  }
  local_1030.data_ = (AssertHelperData *)0x1;
  local_1038._M_head_impl = pbVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_1028,"(size_t)size","(size_t)sizeof(result)",(unsigned_long *)&local_1038,
             (unsigned_long *)&local_1030);
  if (local_1028[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1038);
    if (local_1020 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_1020;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x173,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1030,(Message *)&local_1038);
    testing::internal::AssertHelper::~AssertHelper(&local_1030);
    if (local_1038._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1038._M_head_impl + 8))();
    }
  }
  puVar1 = local_1020;
  if (local_1020 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1020 != local_1020 + 2) {
      operator_delete((undefined8 *)*local_1020);
    }
    operator_delete(puVar1);
  }
  local_1038._M_head_impl = local_1038._M_head_impl & 0xffffffffffffff00;
  local_1030.data_ = local_1030.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<char,char>
            (local_1028,"(char)\'\\0\'","(char)result[size - 1]",(char *)&local_1038,
             (char *)&local_1030);
  if (local_1028[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1038);
    if (local_1020 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_1020;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x174,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1030,(Message *)&local_1038);
    testing::internal::AssertHelper::~AssertHelper(&local_1030);
    if (local_1038._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1038._M_head_impl + 8))();
    }
  }
  if (local_1020 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1020 != local_1020 + 2) {
      operator_delete((undefined8 *)*local_1020);
    }
    operator_delete(local_1020);
  }
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_join_both_empty)
{
	static const char left[] = "";
	static const char right[] = "";
	static const char result[] = "";

	string_path join;

	size_t size = portability_path_join(left, sizeof(left), right, sizeof(right), join, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(join, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}